

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

uint32_t leb__HeapRead(leb_Heap *leb,leb_Node node)

{
  int32_t bitCount;
  uint32_t uVar1;
  leb_Heap *leb_local;
  leb_Node node_local;
  
  bitCount = leb__NodeBitSize(leb,node);
  uVar1 = leb__HeapReadExplicit(leb,node,bitCount);
  return uVar1;
}

Assistant:

static uint32_t leb__HeapRead(const leb_Heap *leb, const leb_Node node)
{
    return leb__HeapReadExplicit(leb, node, leb__NodeBitSize(leb, node));
}